

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O1

void __thiscall StringFixture_JapaneseUTF8_Test::TestBody(StringFixture_JapaneseUTF8_Test *this)

{
  uchar *in_RCX;
  pointer *__ptr;
  char *message;
  AssertionResult gtest_ar;
  string expected;
  string actual;
  array<unsigned_char,_27UL> chars;
  Message local_98;
  AssertHelper local_90;
  internal local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined3 uStack_28;
  undefined8 uStack_25;
  uchar local_1d [13];
  
  uStack_28 = 0xe39681;
  uStack_25 = 0x9981e3be81e38481;
  local_38 = 0xe38a81e3;
  uStack_34 = 0x82e3af81;
  uStack_30 = 0x8681e388;
  uStack_2c = 0xe39481e3;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,
             "\"\\xE3\\x81\\x8A\\xE3\\x81\\xAF\\xE3\\x82\\x88\\xE3\\x81\\x86\\xE3\\x81\\x94\\xE3\\x81\\x96\\xE3\\x81\\x84\\xE3\\x81\\xBE\\xE3\\x81\\x99\""
             ,"");
  (anonymous_namespace)::StringFixture::convert<unsigned_char*>(&local_58,&local_38,local_1d,in_RCX)
  ;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_88,"expected","actual",&local_78,&local_58);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message(&local_98);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/dump/test_string.cpp"
               ,0x91,message);
    testing::internal::AssertHelper::operator=(&local_90,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_98.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_98.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST_F (StringFixture, JapaneseUTF8) {
    std::array<std::uint8_t, 9 * 3> chars{{
        0xE3, 0x81, 0x8A, // HIRAGANA LETTER O
        0xE3, 0x81, 0xAF, // HIRAGANA LETTER HA
        0xE3, 0x82, 0x88, // HIRAGANA LETTER YO
        0xE3, 0x81, 0x86, // HIRAGANA LETTER U
        0xE3, 0x81, 0x94, // HIRAGANA LETTER GO
        0xE3, 0x81, 0x96, // HIRAGANA LETTER ZA
        0xE3, 0x81, 0x84, // HIRAGANA LETTER I
        0xE3, 0x81, 0xBE, // HIRAGANA LETTER MA
        0xE3, 0x81, 0x99, // HIRAGANA LETTER SU
    }};

    std::string const expected = "\""
                                 "\\xE3\\x81\\x8A"
                                 "\\xE3\\x81\\xAF"
                                 "\\xE3\\x82\\x88"
                                 "\\xE3\\x81\\x86"
                                 "\\xE3\\x81\\x94"
                                 "\\xE3\\x81\\x96"
                                 "\\xE3\\x81\\x84"
                                 "\\xE3\\x81\\xBE"
                                 "\\xE3\\x81\\x99"
                                 "\"";

    std::string actual = this->convert (std::begin (chars), std::end (chars));
    EXPECT_EQ (expected, actual);
}